

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_hkdf_expand_label
              (ptls_hash_algorithm_t *algo,void *output,size_t outlen,ptls_iovec_t secret,
              char *label,ptls_iovec_t hash_value,char *label_prefix)

{
  ptls_iovec_t info;
  ptls_iovec_t prk;
  uint8_t *__ptr;
  size_t sVar1;
  size_t outlen_00;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  uint8_t hkdf_label_buf [80];
  ptls_buffer_t local_e8;
  ptls_hash_algorithm_t *local_c8;
  void *local_c0;
  uint8_t *local_b8;
  size_t local_b0;
  char *local_a8;
  size_t local_a0;
  uint8_t *local_98;
  size_t sStack_90;
  uint8_t local_88 [88];
  
  local_e8.base = local_88;
  local_e8.off = 0;
  local_e8.capacity = 0x50;
  local_e8.is_allocated = '\0';
  local_e8.align_bits = '\0';
  local_a8 = label;
  local_a0 = outlen;
  iVar2 = ptls_buffer_reserve_aligned(&local_e8,2,'\0');
  outlen_00 = local_a0;
  sVar5 = local_e8.off;
  if (iVar2 == 0) {
    *(ushort *)(local_e8.base + local_e8.off) = (ushort)local_a0 << 8 | (ushort)local_a0 >> 8;
    local_e8.off = local_e8.off + 2;
    local_c8 = algo;
    local_c0 = output;
    local_b8 = secret.base;
    local_b0 = secret.len;
    iVar2 = ptls_buffer_reserve_aligned(&local_e8,1,'\0');
    sVar1 = local_e8.off;
    sVar5 = local_e8.off;
    if (iVar2 == 0) {
      local_e8.base[local_e8.off] = '\0';
      sVar6 = local_e8.off + 1;
      pcVar7 = "tls13 ";
      if (label_prefix != (char *)0x0) {
        pcVar7 = label_prefix;
      }
      local_e8.off = sVar6;
      sVar3 = strlen(pcVar7);
      iVar2 = ptls_buffer__do_pushv(&local_e8,pcVar7,sVar3);
      pcVar7 = local_a8;
      sVar5 = local_e8.off;
      if (iVar2 == 0) {
        sVar3 = strlen(local_a8);
        iVar2 = ptls_buffer__do_pushv(&local_e8,pcVar7,sVar3);
        sVar5 = local_e8.off;
        if (iVar2 == 0) {
          uVar4 = local_e8.off - sVar6;
          iVar2 = 0x20c;
          if (uVar4 < 0x100) {
            local_e8.base[sVar1] = (uint8_t)uVar4;
            iVar2 = ptls_buffer_reserve_aligned(&local_e8,1,'\0');
            sVar1 = local_e8.off;
            sVar5 = local_e8.off;
            if (iVar2 == 0) {
              local_e8.base[local_e8.off] = '\0';
              sVar6 = local_e8.off + 1;
              local_e8.off = sVar6;
              iVar2 = ptls_buffer__do_pushv(&local_e8,hash_value.base,hash_value.len);
              sVar5 = local_e8.off;
              if ((iVar2 == 0) && (uVar4 = local_e8.off - sVar6, iVar2 = 0x20c, uVar4 < 0x100)) {
                local_e8.base[sVar1] = (uint8_t)uVar4;
                local_98 = local_e8.base;
                sStack_90 = local_e8.off;
                prk.len = local_b0;
                prk.base = local_b8;
                info.len = local_e8.off;
                info.base = local_e8.base;
                iVar2 = ptls_hkdf_expand(local_c8,local_c0,outlen_00,prk,info);
              }
            }
          }
        }
      }
    }
  }
  __ptr = local_e8.base;
  (*ptls_clear_memory)(local_e8.base,sVar5);
  if (local_e8.is_allocated != '\0') {
    free(__ptr);
  }
  return iVar2;
}

Assistant:

int ptls_hkdf_expand_label(ptls_hash_algorithm_t *algo, void *output, size_t outlen, ptls_iovec_t secret, const char *label,
                           ptls_iovec_t hash_value, const char *label_prefix)
{
    ptls_buffer_t hkdf_label;
    uint8_t hkdf_label_buf[80];
    int ret;

    ptls_buffer_init(&hkdf_label, hkdf_label_buf, sizeof(hkdf_label_buf));

    ptls_buffer_push16(&hkdf_label, (uint16_t)outlen);
    ptls_buffer_push_block(&hkdf_label, 1, {
        if (label_prefix == NULL)
            label_prefix = PTLS_HKDF_EXPAND_LABEL_PREFIX;
        ptls_buffer_pushv(&hkdf_label, label_prefix, strlen(label_prefix));
        ptls_buffer_pushv(&hkdf_label, label, strlen(label));
    });
    ptls_buffer_push_block(&hkdf_label, 1, { ptls_buffer_pushv(&hkdf_label, hash_value.base, hash_value.len); });

    ret = ptls_hkdf_expand(algo, output, outlen, secret, ptls_iovec_init(hkdf_label.base, hkdf_label.off));

Exit:
    ptls_buffer_dispose(&hkdf_label);
    return ret;
}